

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall tf::Executor::_join_dynamic_task_internal(Executor *this,Worker *w,Node *p,Graph *g)

{
  pointer ppNVar1;
  long *plVar2;
  Worker *w_00;
  long *plVar3;
  pointer ppNVar4;
  __int_type_conflict _Var5;
  Node *n;
  SmallVector<tf::Node_*,_2U> src;
  Node *local_68;
  Worker *local_60;
  SmallVector<tf::Node_*,_2U> local_58;
  
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &stack0xffffffffffffffd0;
  if (((g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((p->_join_counter).super___atomic_base<unsigned_long>._M_i != 0)) {
    local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
         &local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
          .super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ppNVar4 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar1 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_60 = w;
    local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
         local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    if (ppNVar4 != ppNVar1) {
      local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           &stack0xffffffffffffffd0;
      do {
        local_68 = *ppNVar4;
        local_68->_topology = p->_topology;
        (local_68->_state).super___atomic_base<int>._M_i = 0;
        plVar2 = (long *)(local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
                         super_SmallVectorTemplateBase<tf::Node_*,_true>.
                         super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                         EndX;
        _Var5 = 0;
        for (plVar3 = (long *)(local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
                              super_SmallVectorTemplateBase<tf::Node_*,_true>.
                              super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                              super_SmallVectorBase.BeginX; plVar3 != plVar2; plVar3 = plVar3 + 1) {
          if ((byte)(*(char *)(*plVar3 + 0x68) - 3U) < 2) {
            LOCK();
            (local_68->_state).super___atomic_base<int>._M_i =
                 (local_68->_state).super___atomic_base<int>._M_i | 1;
            UNLOCK();
          }
          else {
            _Var5 = _Var5 + 1;
          }
        }
        (local_68->_join_counter).super___atomic_base<unsigned_long>._M_i = _Var5;
        local_68->_parent = p;
        if ((local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX ==
            (local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX) {
          SmallVectorTemplateBase<tf::Node_*,_true>::push_back
                    ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_58,&local_68);
        }
        ppNVar4 = ppNVar4 + 1;
      } while (ppNVar4 != ppNVar1);
    }
    w_00 = local_60;
    LOCK();
    (p->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (p->_join_counter).super___atomic_base<unsigned_long>._M_i +
         ((long)local_58.super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
          (long)local_58.super_SmallVectorImpl<tf::Node_*>.
                super_SmallVectorTemplateBase<tf::Node_*,_true>.
                super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3)
    ;
    UNLOCK();
    _schedule(this,local_60,&local_58);
    _consume_task(this,w_00,p);
    if ((U *)local_58.super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX !=
        &local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
      free(local_58.super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
    }
  }
  return;
}

Assistant:

inline void Executor::_join_dynamic_task_internal(
  Worker& w, Node* p, Graph& g
) {

  // graph is empty and has no async tasks
  if(g.empty() && p->_join_counter == 0) {
    return;
  }

  SmallVector<Node*> src;

  for(auto n : g._nodes) {
    n->_topology = p->_topology;
    n->_state.store(0, std::memory_order_relaxed);
    n->_set_up_join_counter();
    n->_parent = p;
    if(n->num_dependents() == 0) {
      src.push_back(n);
    }
  }
  p->_join_counter.fetch_add(src.size());
  _schedule(w, src);
  _consume_task(w, p);
}